

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O2

SPIRType * __thiscall
diligent_spirv_cross::Parser::set<diligent_spirv_cross::SPIRType,diligent_spirv_cross::SPIRType&>
          (Parser *this,uint32_t id,SPIRType *args)

{
  SPIRType *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeType,(ID)id);
  pSVar1 = variant_set<diligent_spirv_cross::SPIRType,diligent_spirv_cross::SPIRType&>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id,args);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}